

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O0

LY_ERR lys_compile_iffeature(ly_ctx *ctx,lysp_qname *qname,lysc_iffeature *iff)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  ushort **ppuVar4;
  uint8_t *puVar5;
  long lVar6;
  lysp_feature *plVar7;
  bool bVar8;
  bool bVar9;
  long *local_a0;
  char *p__;
  uint64_t spaces;
  lysp_feature *f;
  iff_stack stack;
  uint64_t uStack_68;
  uint8_t op;
  uint64_t f_exp;
  uint64_t expr_size;
  uint64_t f_size;
  int8_t checkversion;
  int8_t last_not;
  long lStack_48;
  int8_t op_len;
  int64_t j;
  int64_t i;
  char *c;
  LY_ERR rc;
  lysc_iffeature *iff_local;
  lysp_qname *qname_local;
  ly_ctx *ctx_local;
  
  c._4_4_ = LY_SUCCESS;
  pcVar1 = qname->str;
  f_size._6_1_ = false;
  bVar9 = false;
  expr_size = 0;
  f_exp = 0;
  uStack_68 = 1;
  memset(&f,0,0x18);
  if (pcVar1 == (char *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                  ,0x146,
                  "LY_ERR lys_compile_iffeature(const struct ly_ctx *, const struct lysp_qname *, struct lysc_iffeature *)"
                 );
  }
  lStack_48 = 0;
  for (j = 0; pcVar1[j] != '\0'; j = j + 1) {
    if (pcVar1[j] == '(') {
      lStack_48 = lStack_48 + 1;
      bVar9 = true;
    }
    else if (pcVar1[j] == ')') {
      lStack_48 = lStack_48 + -1;
    }
    else {
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[(int)pcVar1[j]] & 0x2000) == 0) {
        f_size._7_1_ = '\x03';
        iVar3 = strncmp(pcVar1 + j,"not",3);
        if (iVar3 == 0) {
LAB_00187d57:
          p__ = (char *)0x0;
          while( true ) {
            bVar8 = false;
            if (p__[(long)(pcVar1 + j + f_size._7_1_)] != '\0') {
              ppuVar4 = __ctype_b_loc();
              bVar8 = ((*ppuVar4)[(int)p__[(long)(pcVar1 + j + f_size._7_1_)]] & 0x2000) != 0;
            }
            if (!bVar8) break;
            p__ = p__ + 1;
          }
          if (p__[(long)(pcVar1 + j + f_size._7_1_)] == '\0') {
            ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid value \"%s\" of if-feature - unexpected end of expression.",qname->str)
            ;
            return LY_EVALID;
          }
          ppuVar4 = __ctype_b_loc();
          if (((*ppuVar4)[(int)pcVar1[j + f_size._7_1_]] & 0x2000) == 0) {
            f_size._6_1_ = false;
            expr_size = expr_size + 1;
          }
          else if (pcVar1[j] == 'n') {
            f_size._6_1_ = !f_size._6_1_;
            if (!f_size._6_1_) {
              f_exp = f_exp - 2;
            }
          }
          else {
            if (uStack_68 != expr_size) {
              ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid value \"%s\" of if-feature - missing feature/expression before \"%.*s\" operation."
                      ,qname->str,(ulong)(uint)(int)f_size._7_1_,pcVar1 + j);
              return LY_EVALID;
            }
            uStack_68 = uStack_68 + 1;
            f_size._6_1_ = false;
          }
          j = f_size._7_1_ + j;
        }
        else {
          f_size._7_1_ = '\x03';
          iVar3 = strncmp(pcVar1 + j,"and",3);
          if (iVar3 == 0) goto LAB_00187d57;
          f_size._7_1_ = '\x02';
          iVar3 = strncmp(pcVar1 + j,"or",2);
          if (iVar3 == 0) goto LAB_00187d57;
          expr_size = expr_size + 1;
          f_size._6_1_ = false;
        }
        f_exp = f_exp + 1;
        while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)pcVar1[j]] & 0x2000) == 0) {
          if (((pcVar1[j] == '\0') || (pcVar1[j] == ')')) || (pcVar1[j] == '(')) {
            j = j + -1;
            break;
          }
          j = j + 1;
        }
      }
      else {
        bVar9 = true;
      }
    }
  }
  if (lStack_48 == 0) {
    if (uStack_68 == expr_size) {
      if (((bVar9) || (1 < f_exp)) && (qname->mod->version != '\x02')) {
        ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid value \"%s\" of if-feature - YANG 1.1 expression in YANG 1.0 module.",
                qname->str);
        ctx_local._4_4_ = LY_EVALID;
      }
      else {
        if (iff->features == (lysp_feature **)0x0) {
          local_a0 = (long *)calloc(1,expr_size * 8 + 8);
          if (local_a0 == (long *)0x0) {
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_iffeature");
            return LY_EMEM;
          }
        }
        else {
          local_a0 = (long *)realloc(iff->features + -1,
                                     ((long)&iff->features[-1]->name + expr_size) * 8 + 8);
          if (local_a0 == (long *)0x0) {
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_iffeature");
            return LY_EMEM;
          }
        }
        iff->features = (lysp_feature **)(local_a0 + 1);
        if (iff->features != (lysp_feature **)0x0) {
          memset(iff->features + *local_a0,0,expr_size << 3);
        }
        puVar5 = (uint8_t *)calloc((f_exp >> 2) + (long)(int)(uint)((f_exp & 3) != 0),1);
        iff->expr = puVar5;
        stack.index = (size_t)malloc(f_exp);
        if (((void *)stack.index == (void *)0x0) || (iff->expr == (uint8_t *)0x0)) {
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_iffeature");
          c._4_4_ = LY_EMEM;
        }
        else {
          f = (lysp_feature *)f_exp;
          expr_size = expr_size - 1;
          f_exp = f_exp - 1;
          while (lVar2 = j, j = lVar2 + -1, -1 < j) {
            if (pcVar1[j] == ')') {
              iff_stack_push((iff_stack *)&f,'\b');
            }
            else if (pcVar1[j] == '(') {
              while (stack.stack._7_1_ = iff_stack_pop((iff_stack *)&f), stack.stack._7_1_ != '\b')
              {
                iff_setop(iff->expr,stack.stack._7_1_,f_exp);
                f_exp = f_exp - 1;
              }
            }
            else {
              ppuVar4 = __ctype_b_loc();
              if (((*ppuVar4)[(int)pcVar1[j]] & 0x2000) == 0) {
                while( true ) {
                  bVar9 = false;
                  if (-1 < j) {
                    ppuVar4 = __ctype_b_loc();
                    bVar9 = false;
                    if (((*ppuVar4)[(int)pcVar1[j]] & 0x2000) == 0) {
                      bVar9 = pcVar1[j] != '(';
                    }
                  }
                  if (!bVar9) break;
                  j = j + -1;
                }
                lVar6 = j + 1;
                iVar3 = strncmp(pcVar1 + lVar6,"not",3);
                if ((iVar3 == 0) &&
                   (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)pcVar1[j + 4]] & 0x2000) != 0)) {
                  if ((stack.size == 0) || (*(char *)(stack.index + (stack.size - 1)) != '\0')) {
                    iff_stack_push((iff_stack *)&f,'\0');
                    j = lVar6;
                  }
                  else {
                    iff_stack_pop((iff_stack *)&f);
                    j = lVar6;
                  }
                }
                else {
                  iVar3 = strncmp(pcVar1 + lVar6,"and",3);
                  if ((iVar3 == 0) &&
                     (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)pcVar1[j + 4]] & 0x2000) != 0)) {
                    while( true ) {
                      bVar9 = false;
                      if (stack.size != 0) {
                        bVar9 = *(byte *)(stack.index + (stack.size - 1)) < 2;
                      }
                      if (!bVar9) break;
                      stack.stack._7_1_ = iff_stack_pop((iff_stack *)&f);
                      iff_setop(iff->expr,stack.stack._7_1_,f_exp);
                      f_exp = f_exp - 1;
                    }
                    iff_stack_push((iff_stack *)&f,'\x01');
                    j = lVar6;
                  }
                  else {
                    iVar3 = strncmp(pcVar1 + lVar6,"or",2);
                    if ((iVar3 == 0) &&
                       (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)pcVar1[j + 3]] & 0x2000) != 0))
                    {
                      while( true ) {
                        bVar9 = false;
                        if (stack.size != 0) {
                          bVar9 = *(byte *)(stack.index + (stack.size - 1)) < 3;
                        }
                        if (!bVar9) break;
                        stack.stack._7_1_ = iff_stack_pop((iff_stack *)&f);
                        iff_setop(iff->expr,stack.stack._7_1_,f_exp);
                        f_exp = f_exp - 1;
                      }
                      iff_stack_push((iff_stack *)&f,'\x02');
                      j = lVar6;
                    }
                    else {
                      iff_setop(iff->expr,'\x03',f_exp);
                      plVar7 = lysp_feature_find(qname->mod,pcVar1 + lVar6,lVar2 - lVar6,'\x01');
                      if (plVar7 == (lysp_feature *)0x0) {
                        ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                                "Invalid value \"%s\" of if-feature - unable to find feature \"%.*s\"."
                                ,qname->str,(ulong)(uint)((int)lVar2 - (int)lVar6),pcVar1 + lVar6);
                        c._4_4_ = LY_EVALID;
                        goto LAB_001886ef;
                      }
                      iff->features[expr_size] = plVar7;
                      iff->features[-1] = (lysp_feature *)((long)&iff->features[-1]->name + 1);
                      expr_size = expr_size - 1;
                      f_exp = f_exp - 1;
                      j = lVar6;
                    }
                  }
                }
              }
            }
          }
          while (stack.size != 0) {
            stack.stack._7_1_ = iff_stack_pop((iff_stack *)&f);
            iff_setop(iff->expr,stack.stack._7_1_,f_exp);
            f_exp = f_exp - 1;
          }
          if ((f_exp != 0xffffffffffffffff) || (expr_size != 0xffffffffffffffff)) {
            ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid value \"%s\" of if-feature - processing error.",qname->str);
            c._4_4_ = LY_EINT;
          }
        }
LAB_001886ef:
        if (c._4_4_ != LY_SUCCESS) {
          if (iff->features != (lysp_feature **)0x0) {
            free(iff->features + -1);
          }
          iff->features = (lysp_feature **)0x0;
          free(iff->expr);
          iff->expr = (uint8_t *)0x0;
        }
        iff_stack_clean((iff_stack *)&f);
        ctx_local._4_4_ = c._4_4_;
      }
    }
    else {
      ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
              "Invalid value \"%s\" of if-feature - number of features in expression does not match the required number of operands for the operations."
              ,qname->str);
      ctx_local._4_4_ = LY_EVALID;
    }
  }
  else {
    ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
            "Invalid value \"%s\" of if-feature - non-matching opening and closing parentheses.",
            qname->str);
    ctx_local._4_4_ = LY_EVALID;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lys_compile_iffeature(const struct ly_ctx *ctx, const struct lysp_qname *qname, struct lysc_iffeature *iff)
{
    LY_ERR rc = LY_SUCCESS;
    const char *c = qname->str;
    int64_t i, j;
    int8_t op_len, last_not = 0, checkversion = 0;
    LY_ARRAY_COUNT_TYPE f_size = 0, expr_size = 0, f_exp = 1;
    uint8_t op;
    struct iff_stack stack = {0, 0, NULL};
    struct lysp_feature *f;

    assert(c);

    /* pre-parse the expression to get sizes for arrays, also do some syntax checks of the expression */
    for (i = j = 0; c[i]; i++) {
        if (c[i] == '(') {
            j++;
            checkversion = 1;
            continue;
        } else if (c[i] == ')') {
            j--;
            continue;
        } else if (isspace(c[i])) {
            checkversion = 1;
            continue;
        }

        if (!strncmp(&c[i], "not", op_len = ly_strlen_const("not")) ||
                !strncmp(&c[i], "and", op_len = ly_strlen_const("and")) ||
                !strncmp(&c[i], "or", op_len = ly_strlen_const("or"))) {
            uint64_t spaces;

            for (spaces = 0; c[i + op_len + spaces] && isspace(c[i + op_len + spaces]); spaces++) {}
            if (c[i + op_len + spaces] == '\0') {
                LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - unexpected end of expression.", qname->str);
                return LY_EVALID;
            } else if (!isspace(c[i + op_len])) {
                /* feature name starting with the not/and/or */
                last_not = 0;
                f_size++;
            } else if (c[i] == 'n') { /* not operation */
                if (last_not) {
                    /* double not */
                    expr_size = expr_size - 2;
                    last_not = 0;
                } else {
                    last_not = 1;
                }
            } else { /* and, or */
                if (f_exp != f_size) {
                    LOGVAL(ctx, LYVE_SYNTAX_YANG,
                            "Invalid value \"%s\" of if-feature - missing feature/expression before \"%.*s\" operation.",
                            qname->str, op_len, &c[i]);
                    return LY_EVALID;
                }
                f_exp++;

                /* not a not operation */
                last_not = 0;
            }
            i += op_len;
        } else {
            f_size++;
            last_not = 0;
        }
        expr_size++;

        while (!isspace(c[i])) {
            if (!c[i] || (c[i] == ')') || (c[i] == '(')) {
                i--;
                break;
            }
            i++;
        }
    }
    if (j) {
        /* not matching count of ( and ) */
        LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - non-matching opening and closing parentheses.",
                qname->str);
        return LY_EVALID;
    }
    if (f_exp != f_size) {
        /* features do not match the needed arguments for the logical operations */
        LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - number of features in expression does not match "
                "the required number of operands for the operations.", qname->str);
        return LY_EVALID;
    }

    if (checkversion || (expr_size > 1)) {
        /* check that we have 1.1 module */
        if (qname->mod->version != LYS_VERSION_1_1) {
            LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - YANG 1.1 expression in YANG 1.0 module.",
                    qname->str);
            return LY_EVALID;
        }
    }

    /* allocate the memory */
    LY_ARRAY_CREATE_RET(ctx, iff->features, f_size, LY_EMEM);
    iff->expr = calloc((j = (expr_size / IFF_RECORDS_IN_BYTE) + ((expr_size % IFF_RECORDS_IN_BYTE) ? 1 : 0)), sizeof *iff->expr);
    stack.stack = malloc(expr_size * sizeof *stack.stack);
    LY_CHECK_ERR_GOTO(!stack.stack || !iff->expr, LOGMEM(ctx); rc = LY_EMEM, cleanup);

    stack.size = expr_size;
    f_size--; expr_size--; /* used as indexes from now */

    for (i--; i >= 0; i--) {
        if (c[i] == ')') {
            /* push it on stack */
            iff_stack_push(&stack, LYS_IFF_RP);
            continue;
        } else if (c[i] == '(') {
            /* pop from the stack into result all operators until ) */
            while ((op = iff_stack_pop(&stack)) != LYS_IFF_RP) {
                iff_setop(iff->expr, op, expr_size--);
            }
            continue;
        } else if (isspace(c[i])) {
            continue;
        }

        /* end of operator or operand -> find beginning and get what is it */
        j = i + 1;
        while (i >= 0 && !isspace(c[i]) && c[i] != '(') {
            i--;
        }
        i++; /* go back by one step */

        if (!strncmp(&c[i], "not", ly_strlen_const("not")) && isspace(c[i + ly_strlen_const("not")])) {
            if (stack.index && (stack.stack[stack.index - 1] == LYS_IFF_NOT)) {
                /* double not */
                iff_stack_pop(&stack);
            } else {
                /* not has the highest priority, so do not pop from the stack
                 * as in case of AND and OR */
                iff_stack_push(&stack, LYS_IFF_NOT);
            }
        } else if (!strncmp(&c[i], "and", ly_strlen_const("and")) && isspace(c[i + ly_strlen_const("and")])) {
            /* as for OR - pop from the stack all operators with the same or higher
             * priority and store them to the result, then push the AND to the stack */
            while (stack.index && stack.stack[stack.index - 1] <= LYS_IFF_AND) {
                op = iff_stack_pop(&stack);
                iff_setop(iff->expr, op, expr_size--);
            }
            iff_stack_push(&stack, LYS_IFF_AND);
        } else if (!strncmp(&c[i], "or", 2) && isspace(c[i + 2])) {
            while (stack.index && stack.stack[stack.index - 1] <= LYS_IFF_OR) {
                op = iff_stack_pop(&stack);
                iff_setop(iff->expr, op, expr_size--);
            }
            iff_stack_push(&stack, LYS_IFF_OR);
        } else {
            /* feature name, length is j - i */

            /* add it to the expression */
            iff_setop(iff->expr, LYS_IFF_F, expr_size--);

            /* now get the link to the feature definition */
            f = lysp_feature_find(qname->mod, &c[i], j - i, 1);
            if (!f) {
                LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - unable to find feature \"%.*s\".",
                        qname->str, (int)(j - i), &c[i]);
                rc = LY_EVALID;
                goto cleanup;
            }
            iff->features[f_size] = f;
            LY_ARRAY_INCREMENT(iff->features);
            f_size--;
        }
    }
    while (stack.index) {
        op = iff_stack_pop(&stack);
        iff_setop(iff->expr, op, expr_size--);
    }

    if (++expr_size || ++f_size) {
        /* not all expected operators and operands found */
        LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - processing error.", qname->str);
        rc = LY_EINT;
    }

cleanup:
    if (rc) {
        LY_ARRAY_FREE(iff->features);
        iff->features = NULL;
        free(iff->expr);
        iff->expr = NULL;
    }
    iff_stack_clean(&stack);
    return rc;
}